

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O2

void __thiscall
CoreML::NeuralNetworkShaper::shapeReorganizeDataLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  Type *pTVar1;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar2;
  undefined1 *from;
  ReorganizeDataLayerParams reorg;
  ShapeRange local_60;
  ReorganizeDataLayerParams local_40;
  
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->input_).super_RepeatedPtrFieldBase,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,pTVar1);
  pTVar1 = google::protobuf::internal::RepeatedPtrFieldBase::
           Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     (&(specLayer->output_).super_RepeatedPtrFieldBase,0);
  ShapeConstraint::setName(this_01,pTVar1);
  pSVar2 = ShapeConstraint::sequenceRange(this_00);
  ShapeConstraint::updateSequenceRange(this_01,pSVar2);
  pSVar2 = ShapeConstraint::batchRange(this_00);
  ShapeConstraint::updateBatchRange(this_01,pSVar2);
  pSVar2 = ShapeConstraint::sequenceRange(this_01);
  ShapeConstraint::updateSequenceRange(this_00,pSVar2);
  pSVar2 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar2);
  if (specLayer->_oneof_case_[0] == 0x159) {
    from = *(undefined1 **)&specLayer->layer_;
  }
  else {
    from = Specification::_ReorganizeDataLayerParams_default_instance_;
  }
  Specification::ReorganizeDataLayerParams::ReorganizeDataLayerParams
            (&local_40,(ReorganizeDataLayerParams *)from);
  if (local_40.mode_ == 0) {
    pSVar2 = ShapeConstraint::channelRange(this_00);
    ShapeRange::operator*(&local_60,pSVar2,local_40.blocksize_ * local_40.blocksize_);
    ShapeConstraint::updateChannelRange(this_01,&local_60);
    pSVar2 = ShapeConstraint::heightRange(this_00);
    ShapeRange::operator/(&local_60,pSVar2,local_40.blocksize_);
    ShapeConstraint::updateHeightRange(this_01,&local_60);
    pSVar2 = ShapeConstraint::widthRange(this_00);
    ShapeRange::operator/(&local_60,pSVar2,local_40.blocksize_);
    ShapeConstraint::updateWidthRange(this_01,&local_60);
    pSVar2 = ShapeConstraint::channelRange(this_01);
    ShapeRange::operator/(&local_60,pSVar2,local_40.blocksize_ * local_40.blocksize_);
    ShapeConstraint::updateChannelRange(this_00,&local_60);
    pSVar2 = ShapeConstraint::heightRange(this_01);
    ShapeRange::operator*(&local_60,pSVar2,local_40.blocksize_);
    ShapeConstraint::updateHeightRange(this_00,&local_60);
    pSVar2 = ShapeConstraint::widthRange(this_01);
    ShapeRange::operator*(&local_60,pSVar2,local_40.blocksize_);
    ShapeConstraint::updateWidthRange(this_00,&local_60);
  }
  else {
    pSVar2 = ShapeConstraint::channelRange(this_00);
    ShapeRange::operator/(&local_60,pSVar2,local_40.blocksize_ * local_40.blocksize_);
    ShapeConstraint::updateChannelRange(this_01,&local_60);
    pSVar2 = ShapeConstraint::heightRange(this_00);
    ShapeRange::operator*(&local_60,pSVar2,local_40.blocksize_);
    ShapeConstraint::updateHeightRange(this_01,&local_60);
    pSVar2 = ShapeConstraint::widthRange(this_00);
    ShapeRange::operator*(&local_60,pSVar2,local_40.blocksize_);
    ShapeConstraint::updateWidthRange(this_01,&local_60);
    pSVar2 = ShapeConstraint::channelRange(this_01);
    ShapeRange::operator*(&local_60,pSVar2,local_40.blocksize_ * local_40.blocksize_);
    ShapeConstraint::updateChannelRange(this_00,&local_60);
    pSVar2 = ShapeConstraint::heightRange(this_01);
    ShapeRange::operator/(&local_60,pSVar2,local_40.blocksize_);
    ShapeConstraint::updateHeightRange(this_00,&local_60);
    pSVar2 = ShapeConstraint::widthRange(this_01);
    ShapeRange::operator/(&local_60,pSVar2,local_40.blocksize_);
    ShapeConstraint::updateWidthRange(this_00,&local_60);
  }
  Specification::ReorganizeDataLayerParams::~ReorganizeDataLayerParams(&local_40);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeReorganizeDataLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reorganize Data layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reorganize Data layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(inputShape.sequenceRange());
    outputShape.updateBatchRange(inputShape.batchRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());

    Specification::ReorganizeDataLayerParams reorg = specLayer.reorganizedata();
    size_t blockSize = (size_t)reorg.blocksize();

    if (reorg.mode() == Specification::ReorganizeDataLayerParams::SPACE_TO_DEPTH){
        outputShape.updateChannelRange(inputShape.channelRange() * (blockSize * blockSize));
        outputShape.updateHeightRange(inputShape.heightRange() / blockSize);
        outputShape.updateWidthRange(inputShape.widthRange() / blockSize);
        inputShape.updateChannelRange(outputShape.channelRange() / (blockSize * blockSize));
        inputShape.updateHeightRange(outputShape.heightRange() * blockSize);
        inputShape.updateWidthRange(outputShape.widthRange() * blockSize);
    } else {
        outputShape.updateChannelRange(inputShape.channelRange() / (blockSize * blockSize));
        outputShape.updateHeightRange(inputShape.heightRange() * blockSize);
        outputShape.updateWidthRange(inputShape.widthRange() * blockSize);
        inputShape.updateChannelRange(outputShape.channelRange() * (blockSize * blockSize));
        inputShape.updateHeightRange(outputShape.heightRange() / blockSize);
        inputShape.updateWidthRange(outputShape.widthRange() / blockSize);
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reorganize Data layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reorganize Data layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}